

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall
icu_63::VTimeZone::writeHeaders(VTimeZone *this,VTZWriter *writer,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UnicodeString *pUVar3;
  size_t in_RCX;
  VTZWriter *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  undefined1 local_b0 [8];
  UnicodeString lastmodStr;
  undefined1 local_60 [8];
  UnicodeString tzid;
  UErrorCode *status_local;
  VTZWriter *writer_local;
  VTimeZone *this_local;
  
  tzid.fUnion._48_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UnicodeString::UnicodeString((UnicodeString *)local_60);
    TimeZone::getID(&this->tz->super_TimeZone,(UnicodeString *)local_60);
    VTZWriter::write(writer,0x3ea320,__buf,in_RCX);
    VTZWriter::write(writer,0x3a,__buf_00,in_RCX);
    VTZWriter::write(writer,0x3ea330,__buf_01,in_RCX);
    VTZWriter::write(writer,0x3ea42e,__buf_02,in_RCX);
    VTZWriter::write(writer,0x3ea344,__buf_03,in_RCX);
    VTZWriter::write(writer,0x3a,__buf_04,in_RCX);
    VTZWriter::write(writer,(int)local_60,__buf_05,in_RCX);
    VTZWriter::write(writer,0x3ea42e,__buf_06,in_RCX);
    iVar2 = UnicodeString::length(&this->tzurl);
    if (iVar2 != 0) {
      VTZWriter::write(writer,0x3ea34e,__buf_07,in_RCX);
      VTZWriter::write(writer,0x3a,__buf_08,in_RCX);
      VTZWriter::write(writer,(int)this + 0x58,__buf_09,in_RCX);
      VTZWriter::write(writer,0x3ea42e,__buf_10,in_RCX);
    }
    if ((this->lastmod != 1.838821689216e+17) || (NAN(this->lastmod))) {
      UnicodeString::UnicodeString((UnicodeString *)local_b0);
      VTZWriter::write(writer,0x3ea360,__buf_11,in_RCX);
      VTZWriter::write(writer,0x3a,__buf_12,in_RCX);
      __n = writer;
      pUVar3 = getUTCDateTimeString(this->lastmod,(UnicodeString *)local_b0);
      VTZWriter::write(writer,(int)pUVar3,__buf_13,(size_t)__n);
      VTZWriter::write(writer,0x3ea42e,__buf_14,(size_t)__n);
      UnicodeString::~UnicodeString((UnicodeString *)local_b0);
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_60);
  }
  return;
}

Assistant:

void
VTimeZone::writeHeaders(VTZWriter& writer, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    UnicodeString tzid;
    tz->getID(tzid);

    writer.write(ICAL_BEGIN);
    writer.write(COLON);
    writer.write(ICAL_VTIMEZONE);
    writer.write(ICAL_NEWLINE);
    writer.write(ICAL_TZID);
    writer.write(COLON);
    writer.write(tzid);
    writer.write(ICAL_NEWLINE);
    if (tzurl.length() != 0) {
        writer.write(ICAL_TZURL);
        writer.write(COLON);
        writer.write(tzurl);
        writer.write(ICAL_NEWLINE);
    }
    if (lastmod != MAX_MILLIS) {
        UnicodeString lastmodStr;
        writer.write(ICAL_LASTMOD);
        writer.write(COLON);
        writer.write(getUTCDateTimeString(lastmod, lastmodStr));
        writer.write(ICAL_NEWLINE);
    }
}